

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_keyboard_events.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int extraout_EAX;
  ALLEGRO_EVENT_QUEUE *pAVar2;
  undefined8 uVar3;
  uint in_ECX;
  uint extraout_EDX;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  ALLEGRO_EVENT event;
  undefined4 uStack_a8;
  undefined1 uStack_a4;
  int local_78 [2];
  undefined8 local_70;
  int local_58;
  int local_54;
  int local_50;
  char local_4c;
  
  uVar4 = 0x1015a0;
  cVar1 = al_install_system(0x85020700,atexit);
  if (cVar1 == '\0') {
    pcVar6 = "Could not init Allegro.\n";
  }
  else {
    uVar4 = 0x1e0;
    display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      pcVar6 = "al_create_display failed\n";
    }
    else {
      al_map_rgb_f(0,0,0);
      al_clear_to_color();
      al_flip_display();
      cVar1 = al_install_keyboard();
      if (cVar1 == '\0') {
        pcVar6 = "al_install_keyboard failed\n";
      }
      else {
        pAVar2 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
        if (pAVar2 != (ALLEGRO_EVENT_QUEUE *)0x0) {
          event_queue = pAVar2;
          uVar3 = al_get_keyboard_event_source();
          al_register_event_source(pAVar2,uVar3);
          pAVar2 = event_queue;
          uVar3 = al_get_display_event_source(display);
          al_register_event_source(pAVar2,uVar3);
          log_printf("Focus on the main window (black) and press keys to see events. ");
          log_printf("Escape quits.\n\n");
          do {
            while (al_wait_for_event(event_queue,local_78), local_78[0] < 0xc) {
              if (local_78[0] == 10) {
                if (local_58 == 0x3b) {
                  return 0;
                }
                pcVar6 = "KEY_DOWN";
LAB_001014de:
                log_key(pcVar6,local_58,0,0);
              }
              else if (local_78[0] == 0xb) {
                pcVar6 = "KEY_CHAR";
                if (local_4c != '\0') {
                  pcVar6 = "repeat";
                }
                log_key(pcVar6,local_58,local_54,local_50);
              }
            }
            if (local_78[0] == 0xc) {
              pcVar6 = "KEY_UP";
              goto LAB_001014de;
            }
            if (local_78[0] == 0x2e) {
              al_clear_keyboard_state(local_70);
              log_printf("Cleared keyboard state\n");
            }
            else if (local_78[0] == 0x2a) {
              return 0;
            }
          } while( true );
        }
        pcVar6 = "al_create_event_queue failed\n";
        event_queue = (ALLEGRO_EVENT_QUEUE *)0x0;
      }
    }
  }
  abort_example(pcVar6);
  uStack_a4 = 0;
  uStack_a8 = 0;
  uVar5 = 0x20;
  if (0x20 < (int)extraout_EDX) {
    uVar5 = extraout_EDX;
  }
  al_utf8_encode(&uStack_a8,uVar5);
  uVar3 = al_keycode_to_name(uVar4);
  log_printf("%-8s  code=%03d, char=\'%s\' (%4d), modifiers=%08x, [%s]\n",pcVar6,(ulong)uVar4,
             &uStack_a8,(ulong)extraout_EDX,(ulong)in_ECX,uVar3);
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log_monospace();

   display = al_create_display(WIDTH, HEIGHT);
   if (!display) {
      abort_example("al_create_display failed\n");
   }
   al_clear_to_color(al_map_rgb_f(0, 0, 0));
   al_flip_display();

   if (!al_install_keyboard()) {
      abort_example("al_install_keyboard failed\n");
   }

   event_queue = al_create_event_queue();
   if (!event_queue) {
      abort_example("al_create_event_queue failed\n");
   }

   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_display_event_source(display));

   main_loop();

   close_log(false);

   return 0;
}